

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void btLDLTAddTL(btScalar *L,btScalar *d,btScalar *a,int n,int nskip,
                btAlignedObjectArray<float> *scratch)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  int iVar4;
  float *pfVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  ulong uVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  if (1 < n) {
    iVar4 = nskip * 2;
    iVar1 = scratch->m_size;
    if ((iVar1 <= iVar4) && (iVar1 < iVar4)) {
      if (scratch->m_capacity < iVar4) {
        if (nskip == 0) {
          pfVar5 = (float *)0x0;
        }
        else {
          pfVar5 = (float *)btAlignedAllocInternal((long)iVar4 << 2,0x10);
        }
        iVar2 = scratch->m_size;
        if (0 < (long)iVar2) {
          pfVar3 = scratch->m_data;
          lVar6 = 0;
          do {
            pfVar5[lVar6] = pfVar3[lVar6];
            lVar6 = lVar6 + 1;
          } while (iVar2 != lVar6);
        }
        if (scratch->m_data != (float *)0x0) {
          if (scratch->m_ownsMemory == true) {
            btAlignedFreeInternal(scratch->m_data);
          }
          scratch->m_data = (float *)0x0;
        }
        scratch->m_ownsMemory = true;
        scratch->m_data = pfVar5;
        scratch->m_capacity = iVar4;
      }
      if (iVar1 < iVar4) {
        memset(scratch->m_data + iVar1,0,((long)iVar4 - (long)iVar1) * 4);
      }
    }
    scratch->m_size = iVar4;
    pfVar3 = scratch->m_data;
    pfVar5 = pfVar3 + nskip;
    *pfVar3 = 0.0;
    *pfVar5 = 0.0;
    uVar8 = 2;
    if (2 < n) {
      uVar8 = (ulong)(uint)n;
    }
    uVar7 = 1;
    do {
      fVar15 = a[uVar7];
      pfVar5[uVar7] = fVar15 * 0.70710677;
      pfVar3[uVar7] = fVar15 * 0.70710677;
      uVar7 = uVar7 + 1;
    } while (uVar8 != uVar7);
    fVar17 = (*a * 0.5 + 1.0) * 0.70710677;
    fVar19 = (*a * 0.5 + -1.0) * 0.70710677;
    fVar15 = fVar17 * fVar17 * *d + 1.0;
    fVar20 = *d / fVar15;
    fVar18 = fVar17 * fVar20 * fVar19;
    pfVar9 = L + nskip;
    uVar7 = 1;
    do {
      fVar16 = pfVar3[uVar7];
      fVar21 = *pfVar9;
      pfVar3[uVar7] = -fVar17 * fVar21 + fVar16;
      pfVar5[uVar7] = fVar16 * (1.0 - fVar18) + fVar21 * (fVar18 * fVar17 - fVar19);
      uVar7 = uVar7 + 1;
      pfVar9 = pfVar9 + nskip;
    } while (uVar8 != uVar7);
    uVar8 = 2;
    if (2 < n) {
      uVar8 = (ulong)(uint)n;
    }
    pfVar13 = L + (long)nskip + (long)(nskip + 1);
    uVar10 = 1;
    uVar7 = (ulong)(uint)n;
    pfVar9 = pfVar3;
    pfVar14 = pfVar5;
    fVar17 = 1.0 - fVar19 * fVar19 * fVar20;
    do {
      fVar18 = pfVar3[uVar10];
      fVar19 = pfVar5[uVar10];
      fVar20 = fVar18 * fVar18 * d[uVar10] + fVar15;
      fVar21 = d[uVar10] / fVar20;
      fVar15 = fVar15 * fVar21;
      fVar16 = fVar17 - fVar19 * fVar19 * fVar15;
      fVar15 = fVar15 / fVar16;
      d[uVar10] = fVar17 * fVar15;
      uVar10 = uVar10 + 1;
      if (uVar10 < (uint)n) {
        uVar11 = 2;
        pfVar12 = pfVar13;
        do {
          fVar17 = -fVar18 * *pfVar12 + pfVar9[uVar11];
          fVar22 = fVar21 * fVar18 * fVar17 + *pfVar12;
          pfVar9[uVar11] = fVar17;
          fVar17 = -fVar19 * fVar22 + pfVar14[uVar11];
          pfVar14[uVar11] = fVar17;
          *pfVar12 = fVar15 * -fVar19 * fVar17 + fVar22;
          uVar11 = uVar11 + 1;
          pfVar12 = pfVar12 + nskip;
        } while (uVar7 != uVar11);
      }
      pfVar14 = pfVar14 + 1;
      pfVar9 = pfVar9 + 1;
      uVar7 = uVar7 - 1;
      pfVar13 = pfVar13 + (nskip + 1);
      fVar15 = fVar20;
      fVar17 = fVar16;
    } while (uVar10 != uVar8);
  }
  return;
}

Assistant:

void btLDLTAddTL (btScalar *L, btScalar *d, const btScalar *a, int n, int nskip, btAlignedObjectArray<btScalar>& scratch)
{
  btAssert (L && d && a && n > 0 && nskip >= n);

  if (n < 2) return;
  scratch.resize(2*nskip);
  btScalar *W1 = &scratch[0];
  
  btScalar *W2 = W1 + nskip;

  W1[0] = btScalar(0.0);
  W2[0] = btScalar(0.0);
  for (int j=1; j<n; ++j) {
    W1[j] = W2[j] = (btScalar) (a[j] * SIMDSQRT12);
  }
  btScalar W11 = (btScalar) ((btScalar(0.5)*a[0]+1)*SIMDSQRT12);
  btScalar W21 = (btScalar) ((btScalar(0.5)*a[0]-1)*SIMDSQRT12);

  btScalar alpha1 = btScalar(1.0);
  btScalar alpha2 = btScalar(1.0);

  {
    btScalar dee = d[0];
    btScalar alphanew = alpha1 + (W11*W11)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = W11 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (W21*W21)*dee;
    dee /= alphanew;
    //btScalar gamma2 = W21 * dee;
    alpha2 = alphanew;
    btScalar k1 = btScalar(1.0) - W21*gamma1;
    btScalar k2 = W21*gamma1*W11 - W21;
    btScalar *ll = L + nskip;
    for (int p=1; p<n; ll+=nskip, ++p) {
      btScalar Wp = W1[p];
      btScalar ell = *ll;
      W1[p] =    Wp - W11*ell;
      W2[p] = k1*Wp +  k2*ell;
    }
  }

  btScalar *ll = L + (nskip + 1);
  for (int j=1; j<n; ll+=nskip+1, ++j) {
    btScalar k1 = W1[j];
    btScalar k2 = W2[j];

    btScalar dee = d[j];
    btScalar alphanew = alpha1 + (k1*k1)*dee;
    btAssert(alphanew != btScalar(0.0));
    dee /= alphanew;
    btScalar gamma1 = k1 * dee;
    dee *= alpha1;
    alpha1 = alphanew;
    alphanew = alpha2 - (k2*k2)*dee;
    dee /= alphanew;
    btScalar gamma2 = k2 * dee;
    dee *= alpha2;
    d[j] = dee;
    alpha2 = alphanew;

    btScalar *l = ll + nskip;
    for (int p=j+1; p<n; l+=nskip, ++p) {
      btScalar ell = *l;
      btScalar Wp = W1[p] - k1 * ell;
      ell += gamma1 * Wp;
      W1[p] = Wp;
      Wp = W2[p] - k2 * ell;
      ell -= gamma2 * Wp;
      W2[p] = Wp;
      *l = ell;
    }
  }
}